

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void deleteVariableWatchCallbackData(void *client_data)

{
  cmVariableWatchCallbackData *data;
  void *client_data_local;
  
  if (client_data != (void *)0x0) {
    cmVariableWatchCallbackData::~cmVariableWatchCallbackData
              ((cmVariableWatchCallbackData *)client_data);
    operator_delete(client_data,0x28);
  }
  return;
}

Assistant:

static void deleteVariableWatchCallbackData(void* client_data)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);
  delete data;
}